

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNode * __thiscall Parser::len(Parser *this)

{
  ExprNode *this_00;
  ExprNode *this_01;
  undefined8 extraout_RAX;
  Token closeParen;
  Token openParen;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  Token local_170;
  Token local_100;
  Token local_90;
  
  Tokenizer::getToken(&local_90,this->tokenizer);
  if (local_90._symbol == '(') {
    this_00 = variableID(this);
    Tokenizer::getToken(&local_170,this->tokenizer);
    if (local_170._symbol == ')') {
      this_01 = (ExprNode *)operator_new(0x80);
      ExprNode::token(&local_100,this_00);
      LengthExpr::LengthExpr((LengthExpr *)this_01,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._string._M_dataplus._M_p != &local_100._string.field_2) {
        operator_delete(local_100._string._M_dataplus._M_p,
                        local_100._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._relOp._M_dataplus._M_p != &local_100._relOp.field_2) {
        operator_delete(local_100._relOp._M_dataplus._M_p,
                        local_100._relOp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._name._M_dataplus._M_p != &local_100._name.field_2) {
        operator_delete(local_100._name._M_dataplus._M_p,
                        local_100._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._string._M_dataplus._M_p != &local_170._string.field_2) {
        operator_delete(local_170._string._M_dataplus._M_p,
                        local_170._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._relOp._M_dataplus._M_p != &local_170._relOp.field_2) {
        operator_delete(local_170._relOp._M_dataplus._M_p,
                        local_170._relOp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._name._M_dataplus._M_p != &local_170._name.field_2) {
        operator_delete(local_170._name._M_dataplus._M_p,
                        local_170._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._string._M_dataplus._M_p != &local_90._string.field_2) {
        operator_delete(local_90._string._M_dataplus._M_p,
                        local_90._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._relOp._M_dataplus._M_p != &local_90._relOp.field_2) {
        operator_delete(local_90._relOp._M_dataplus._M_p,
                        local_90._relOp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._name._M_dataplus._M_p != &local_90._name.field_2) {
        operator_delete(local_90._name._M_dataplus._M_p,
                        local_90._name.field_2._M_allocated_capacity + 1);
      }
      return this_01;
    }
  }
  else {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Parser::sub","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"Expected an ( sign, instead got","");
    die(this,&local_190,&local_1b0,&local_90);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Parser::sub","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"Expected an ) sign, instead got","");
  die(this,&local_1d0,&local_1f0,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  Token::~Token(&local_170);
  Token::~Token(&local_90);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ExprNode *Parser::len() {
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::sub", "Expected an ( sign, instead got", openParen);
    ExprNode *id = variableID();
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::sub", "Expected an ) sign, instead got", closeParen);
    return new LengthExpr(id->token());
}